

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O3

void __thiscall
wabt::OptionParser::Argument::Argument
          (Argument *this,string *name,ArgumentCount count,Callback *callback)

{
  pointer pcVar1;
  _Manager_type p_Var2;
  _Invoker_type p_Var3;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  this->count = count;
  *(undefined8 *)&(this->callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8) = 0;
  (this->callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback)._M_invoker = (_Invoker_type)0x0;
  p_Var2 = (callback->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->callback,(_Any_data *)callback,__clone_functor);
    p_Var3 = callback->_M_invoker;
    (this->callback).super__Function_base._M_manager = (callback->super__Function_base)._M_manager;
    (this->callback)._M_invoker = p_Var3;
  }
  this->handled_count = 0;
  return;
}

Assistant:

OptionParser::Argument::Argument(const std::string& name,
                                 ArgumentCount count,
                                 const Callback& callback)
    : name(name), count(count), callback(callback) {}